

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallFilesGenerator::cmInstallFilesGenerator
          (cmInstallFilesGenerator *this,cmMakefile *mf,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,char *dest,bool programs,char *file_permissions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations,char *component,MessageLevel message,char *rename,bool optional)

{
  size_type sVar1;
  pointer input;
  allocator local_32;
  allocator local_31;
  
  cmInstallGenerator::cmInstallGenerator
            (&this->super_cmInstallGenerator,dest,configurations,component,message);
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallFilesGenerator_0057ade0;
  this->Makefile = mf;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Files,files);
  std::__cxx11::string::string((string *)&this->FilePermissions,file_permissions,&local_31);
  std::__cxx11::string::string((string *)&this->Rename,rename,&local_32);
  this->Programs = programs;
  this->Optional = optional;
  for (input = (files->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ((this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig == false &&
      (input != (files->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish)); input = input + 1) {
    sVar1 = cmGeneratorExpression::Find(input);
    if (sVar1 != 0xffffffffffffffff) {
      (this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig = true;
    }
  }
  return;
}

Assistant:

cmInstallFilesGenerator
::cmInstallFilesGenerator(cmMakefile* mf,
                          std::vector<std::string> const& files,
                          const char* dest, bool programs,
                          const char* file_permissions,
                          std::vector<std::string> const& configurations,
                          const char* component,
                          MessageLevel message,
                          const char* rename,
                          bool optional):
  cmInstallGenerator(dest, configurations, component, message),
  Makefile(mf),
  Files(files),
  FilePermissions(file_permissions),
  Rename(rename),
  Programs(programs),
  Optional(optional)
{
  // We need per-config actions if any files have generator expressions.
  for(std::vector<std::string>::const_iterator i = files.begin();
      !this->ActionsPerConfig && i != files.end(); ++i)
    {
    if(cmGeneratorExpression::Find(*i) != std::string::npos)
      {
      this->ActionsPerConfig = true;
      }
    }
}